

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerHLSL::to_sampler_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,uint32_t id)

{
  char *pcVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  size_type index;
  string local_60;
  undefined1 local_40 [8];
  string expr;
  uint32_t id_local;
  CompilerHLSL *this_local;
  
  expr.field_2._12_4_ = id;
  CompilerGLSL::to_non_uniform_aware_expression_abi_cxx11_(&local_60,&this->super_CompilerGLSL,id);
  join<char_const(&)[2],std::__cxx11::string>
            ((string *)local_40,(spirv_cross *)0x66305e,(char (*) [2])&local_60,in_RCX);
  ::std::__cxx11::string::~string((string *)&local_60);
  pcVar1 = (char *)::std::__cxx11::string::find_first_of((char)local_40,0x5b);
  if (pcVar1 == (char *)0xffffffffffffffff) {
    ::std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                     "_sampler");
  }
  else {
    psVar2 = (string *)::std::__cxx11::string::insert((ulong)local_40,pcVar1);
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,psVar2);
  }
  ::std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::to_sampler_expression(uint32_t id)
{
	auto expr = join("_", to_non_uniform_aware_expression(id));
	auto index = expr.find_first_of('[');
	if (index == string::npos)
	{
		return expr + "_sampler";
	}
	else
	{
		// We have an expression like _ident[array], so we cannot tack on _sampler, insert it inside the string instead.
		return expr.insert(index, "_sampler");
	}
}